

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlOutputBufferWriteQuotedString(xmlOutputBufferPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  xmlChar *local_28;
  xmlChar *base;
  xmlChar *cur;
  xmlChar *string_local;
  xmlOutputBufferPtr buf_local;
  
  if ((buf != (xmlOutputBufferPtr)0x0) && (buf->error == 0)) {
    pxVar1 = xmlStrchr(string,'\"');
    if (pxVar1 == (xmlChar *)0x0) {
      xmlOutputBufferWrite(buf,1,"\"");
      xmlOutputBufferWriteString(buf,(char *)string);
      xmlOutputBufferWrite(buf,1,"\"");
    }
    else {
      pxVar1 = xmlStrchr(string,'\'');
      if (pxVar1 == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,1,"\'");
        xmlOutputBufferWriteString(buf,(char *)string);
        xmlOutputBufferWrite(buf,1,"\'");
      }
      else {
        xmlOutputBufferWrite(buf,1,"\"");
        local_28 = string;
        base = string;
        while( true ) {
          if (*base == '\0') break;
          if (*base == '\"') {
            if (local_28 != base) {
              xmlOutputBufferWrite(buf,(int)base - (int)local_28,(char *)local_28);
            }
            xmlOutputBufferWrite(buf,6,"&quot;");
            local_28 = base + 1;
          }
          base = base + 1;
        }
        if (local_28 != base) {
          xmlOutputBufferWrite(buf,(int)base - (int)local_28,(char *)local_28);
        }
        xmlOutputBufferWrite(buf,1,"\"");
      }
    }
  }
  return;
}

Assistant:

void
xmlOutputBufferWriteQuotedString(xmlOutputBufferPtr buf,
                                 const xmlChar *string) {
    const xmlChar *cur, *base;

    if ((buf == NULL) || (buf->error))
        return;

    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
	    xmlOutputBufferWrite(buf, 1, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlOutputBufferWrite(buf, cur - base,
                                             (const char *) base);
                    xmlOutputBufferWrite(buf, 6, "&quot;");
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlOutputBufferWrite(buf, cur - base, (const char *) base);
	    xmlOutputBufferWrite(buf, 1, "\"");
	}
        else{
	    xmlOutputBufferWrite(buf, 1, "'");
            xmlOutputBufferWriteString(buf, (const char *) string);
	    xmlOutputBufferWrite(buf, 1, "'");
        }
    } else {
        xmlOutputBufferWrite(buf, 1, "\"");
        xmlOutputBufferWriteString(buf, (const char *) string);
        xmlOutputBufferWrite(buf, 1, "\"");
    }
}